

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void sysbvm_dwarf_debugInfo_attribute_textAddress
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uintptr_t value)

{
  bool bVar1;
  size_t sVar2;
  uint32_t addressOffset;
  byte local_3e [2];
  undefined4 local_3c;
  uintptr_t local_38;
  
  do {
    local_3e[0] = (0x7f < attribute) << 7 | (byte)attribute & 0x7f;
    sysbvm_dynarray_add(&builder->abbrev,local_3e);
    bVar1 = 0x7f < attribute;
    attribute = attribute >> 7;
  } while (bVar1);
  local_3e[1] = 1;
  sysbvm_dynarray_add(&builder->abbrev,local_3e + 1);
  sVar2 = (builder->info).size;
  local_38 = value;
  sysbvm_dynarray_addAll(&builder->info,8,&local_38);
  local_3c = (int)sVar2;
  sysbvm_dynarray_add(&builder->infoTextAddresses,&local_3c);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_textAddress(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uintptr_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_addr);

    uint32_t addressOffset = (uint32_t)sysbvm_dwarf_encodePointer(&builder->info, value);
    sysbvm_dynarray_add(&builder->infoTextAddresses, &addressOffset);
}